

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttpload.c
# Opt level: O1

FT_Error tt_face_load_loca(TT_Face face,FT_Stream stream)

{
  ushort uVar1;
  bool bVar2;
  FT_Error FVar3;
  FT_Error FVar4;
  ulong uVar5;
  FT_ULong FVar6;
  sbyte sVar7;
  ulong uVar8;
  long lVar9;
  TT_Table pTVar10;
  TT_Table pTVar11;
  ulong uVar12;
  FT_ULong table_len;
  FT_ULong local_30;
  
  FVar3 = (*face->goto_table)(face,0x676c7966,stream,&face->glyf_len);
  if ((char)FVar3 == -0x72) {
    face->glyf_len = 0;
    face->glyf_offset = 0;
  }
  else {
    if (FVar3 != 0) {
      return FVar3;
    }
    if (((face->root).internal)->incremental_interface == (FT_Incremental_InterfaceRec *)0x0) {
      FVar6 = FT_Stream_Pos(stream);
      face->glyf_offset = FVar6;
    }
    else {
      face->glyf_offset = 0;
    }
  }
  FVar3 = (*face->goto_table)(face,0x6c6f6361,stream,&local_30);
  FVar4 = 0x90;
  if (FVar3 == 0) {
    if ((face->header).Index_To_Loc_Format == 0) {
      if (0x1ffff < local_30) {
        local_30 = 0x1ffff;
      }
      uVar5 = local_30 >> 1;
      sVar7 = 1;
    }
    else {
      if (0x3ffff < local_30) {
        local_30 = 0x3ffff;
      }
      uVar5 = local_30 >> 2;
      sVar7 = 2;
    }
    face->num_locations = uVar5;
    uVar8 = (face->root).num_glyphs;
    uVar12 = uVar8 + 1;
    if (uVar5 <= uVar8 && uVar5 != uVar12) {
      uVar12 = uVar12 << sVar7;
      pTVar10 = face->dir_tables;
      uVar1 = face->num_tables;
      FVar6 = FT_Stream_Pos(stream);
      if (uVar1 == 0) {
        bVar2 = true;
        uVar5 = 0x7fffffff;
      }
      else {
        pTVar11 = pTVar10 + uVar1;
        uVar5 = 0x7fffffff;
        bVar2 = false;
        do {
          uVar8 = pTVar10->Offset - FVar6;
          if (0 < (long)uVar8 && (long)uVar8 < (long)uVar5) {
            bVar2 = true;
            uVar5 = uVar8;
          }
          pTVar10 = pTVar10 + 1;
        } while (pTVar10 < pTVar11);
        bVar2 = !bVar2;
      }
      if (bVar2) {
        uVar5 = stream->size - FVar6;
      }
      if (uVar5 < uVar12) {
        lVar9 = 0;
        if (face->num_locations != 0) {
          lVar9 = face->num_locations - 1;
        }
        (face->root).num_glyphs = lVar9;
      }
      else {
        face->num_locations = (face->root).num_glyphs + 1;
        local_30 = uVar12;
      }
    }
    FVar4 = FT_Stream_ExtractFrame(stream,local_30,&face->glyph_locations);
  }
  return FVar4;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  tt_face_load_loca( TT_Face    face,
                     FT_Stream  stream )
  {
    FT_Error  error;
    FT_ULong  table_len;
    FT_Int    shift;


    /* we need the size of the `glyf' table for malformed `loca' tables */
    error = face->goto_table( face, TTAG_glyf, stream, &face->glyf_len );

    /* it is possible that a font doesn't have a glyf table at all */
    /* or its size is zero                                         */
    if ( FT_ERR_EQ( error, Table_Missing ) )
    {
      face->glyf_len    = 0;
      face->glyf_offset = 0;
    }
    else if ( error )
      goto Exit;
    else
    {
#ifdef FT_CONFIG_OPTION_INCREMENTAL
      if ( face->root.internal->incremental_interface )
        face->glyf_offset = 0;
      else
#endif
        face->glyf_offset = FT_STREAM_POS();
    }

    FT_TRACE2(( "Locations " ));
    error = face->goto_table( face, TTAG_loca, stream, &table_len );
    if ( error )
    {
      error = FT_THROW( Locations_Missing );
      goto Exit;
    }

    if ( face->header.Index_To_Loc_Format != 0 )
    {
      shift = 2;

      if ( table_len >= 0x40000L )
      {
        FT_TRACE2(( "table too large\n" ));
        table_len = 0x3FFFFL;
      }
      face->num_locations = table_len >> shift;
    }
    else
    {
      shift = 1;

      if ( table_len >= 0x20000L )
      {
        FT_TRACE2(( "table too large\n" ));
        table_len = 0x1FFFFL;
      }
      face->num_locations = table_len >> shift;
    }

    if ( face->num_locations != (FT_ULong)face->root.num_glyphs + 1 )
    {
      FT_TRACE2(( "glyph count mismatch!  loca: %d, maxp: %d\n",
                  face->num_locations - 1, face->root.num_glyphs ));

      /* we only handle the case where `maxp' gives a larger value */
      if ( face->num_locations <= (FT_ULong)face->root.num_glyphs )
      {
        FT_ULong  new_loca_len =
                    ( (FT_ULong)face->root.num_glyphs + 1 ) << shift;

        TT_Table  entry = face->dir_tables;
        TT_Table  limit = entry + face->num_tables;

        FT_Long  pos   = (FT_Long)FT_STREAM_POS();
        FT_Long  dist  = 0x7FFFFFFFL;
        FT_Bool  found = 0;


        /* compute the distance to next table in font file */
        for ( ; entry < limit; entry++ )
        {
          FT_Long  diff = (FT_Long)entry->Offset - pos;


          if ( diff > 0 && diff < dist )
          {
            dist  = diff;
            found = 1;
          }
        }

        if ( !found )
        {
          /* `loca' is the last table */
          dist = (FT_Long)stream->size - pos;
        }

        if ( new_loca_len <= (FT_ULong)dist )
        {
          face->num_locations = (FT_ULong)face->root.num_glyphs + 1;
          table_len           = new_loca_len;

          FT_TRACE2(( "adjusting num_locations to %d\n",
                      face->num_locations ));
        }
        else
        {
          face->root.num_glyphs = face->num_locations
                                    ? (FT_Long)face->num_locations - 1 : 0;

          FT_TRACE2(( "adjusting num_glyphs to %d\n",
                      face->root.num_glyphs ));
        }
      }
    }

    /*
     * Extract the frame.  We don't need to decompress it since
     * we are able to parse it directly.
     */
    if ( FT_FRAME_EXTRACT( table_len, face->glyph_locations ) )
      goto Exit;

    FT_TRACE2(( "loaded\n" ));

  Exit:
    return error;
  }